

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaQProp.cpp
# Opt level: O2

void __thiscall NaQuickProp::NaQuickProp(NaQuickProp *this,NaNNUnit *rNN)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  NaVector *this_00;
  
  NaStdBackPropParams::NaStdBackPropParams((NaStdBackPropParams *)&this->field_0x120);
  *(undefined8 *)&this->field_0x110 = 0x176c08;
  *(undefined8 *)&this->field_0x120 = 0x176c48;
  *(undefined8 *)&this->field_0x118 = 0x3ffc000000000000;
  NaStdBackProp::NaStdBackProp
            ((NaStdBackProp *)&this->field_0x140,&PTR_construction_vtable_128__00176b90,rNN);
  this->_vptr_NaQuickProp = (_func_int **)&PTR__NaQuickProp_001769b8;
  *(undefined ***)&this->field_0x110 = &PTR_MaxGrowthFactor_00176a18;
  *(undefined ***)&this->field_0x120 = &PTR_PrintLog_00176a58;
  *(undefined ***)&this->field_0x140 = &PTR__NaQuickProp_00176af0;
  puVar1 = &this->field_0x8;
  lVar4 = 0;
  this_00 = (NaVector *)puVar1;
  do {
    NaVector::NaVector(this_00,0);
    lVar4 = lVar4 + -0x18;
    this_00 = this_00 + 1;
  } while (lVar4 != -0x108);
  uVar2 = NaNeuralNetDescr::InputLayer
                    ((NaNeuralNetDescr *)(&this->field_0x8 + (long)this->_vptr_NaQuickProp[-5]));
  while( true ) {
    uVar3 = NaNeuralNetDescr::OutputLayer
                      ((NaNeuralNetDescr *)(puVar1 + (long)this->_vptr_NaQuickProp[-5]));
    if (uVar3 < uVar2) break;
    uVar3 = NaNeuralNetDescr::Inputs
                      ((NaNeuralNetDescr *)(puVar1 + (long)this->_vptr_NaQuickProp[-5]),uVar2);
    (**(code **)(*(long *)(puVar1 + (ulong)uVar2 * 0x18) + 0x20))
              (puVar1 + (ulong)uVar2 * 0x18,uVar3);
    uVar2 = uVar2 + 1;
  }
  uVar2 = NaNeuralNetDescr::InputLayer
                    ((NaNeuralNetDescr *)(&this->field_0x8 + (long)this->_vptr_NaQuickProp[-5]));
  while( true ) {
    uVar3 = NaNeuralNetDescr::OutputLayer
                      ((NaNeuralNetDescr *)(puVar1 + (long)this->_vptr_NaQuickProp[-5]));
    if (uVar3 < uVar2) break;
    (**(code **)(*(long *)(puVar1 + (ulong)uVar2 * 0x18) + 0x68))(puVar1 + (ulong)uVar2 * 0x18);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

NaQuickProp::NaQuickProp (NaNNUnit& rNN)
: NaStdBackProp(rNN)
{
    unsigned    /*iInput, iNeuron, */iLayer;

    // Assign dimensions
    for(iLayer = nd.InputLayer(); iLayer <= nd.OutputLayer(); ++iLayer){
        Xinp_prev[iLayer].new_dim(nd.Inputs(iLayer));
    }

    // Initalize all values by zero
    for(iLayer = nd.InputLayer(); iLayer <= nd.OutputLayer(); ++iLayer){
        Xinp_prev[iLayer].init_zero();
    }
}